

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<int,_int>::erase
          (iterator *__return_storage_ptr__,QMultiHash<int,_int> *this,const_iterator it)

{
  Chain *pCVar1;
  MultiNodeChain<int> *pMVar2;
  Data *pDVar3;
  Span *pSVar4;
  Chain **ppCVar5;
  MultiNode<int,_int> *pMVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  Span *pSVar10;
  uint uVar11;
  long in_FS_OFFSET;
  piter pVar13;
  Bucket bucket;
  iterator local_48;
  long local_28;
  ulong uVar12;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  detach(&local_48,this,it);
  ppCVar5 = local_48.e;
  __return_storage_ptr__->e = local_48.e;
  (__return_storage_ptr__->i).d = local_48.i.d;
  (__return_storage_ptr__->i).bucket = local_48.i.bucket;
  pCVar1 = *local_48.e;
  pMVar2 = pCVar1->next;
  *local_48.e = pMVar2;
  operator_delete(pCVar1,0x10);
  if (pMVar2 != (MultiNodeChain<int> *)0x0) goto LAB_00486601;
  pMVar6 = QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::node
                     (&__return_storage_ptr__->i);
  if (ppCVar5 == &pMVar6->value) {
    uVar7 = (__return_storage_ptr__->i).bucket;
    pSVar10 = ((__return_storage_ptr__->i).d)->spans + (uVar7 >> 7);
    uVar11 = (uint)uVar7 & 0x7f;
    uVar12 = (ulong)uVar11;
    bucket.index._0_4_ = uVar11;
    bucket.span = pSVar10;
    bucket.index._4_4_ = 0;
    QHashPrivate::Data<QHashPrivate::MultiNode<int,_int>_>::erase(this->d,bucket);
    pDVar3 = this->d;
    pSVar4 = pDVar3->spans;
    uVar7 = ((long)pSVar10 - (long)pSVar4) / 0x90;
    uVar9 = uVar7 << 7 | uVar12;
    pVar13.bucket = uVar9;
    pVar13.d = pDVar3;
    if ((uVar9 == pDVar3->numBuckets - 1) || (pSVar10->offsets[uVar12] == 0xff)) goto LAB_004865a6;
    uVar7 = uVar7 & 0x1ffffffffffffff;
    pSVar10 = pSVar4 + uVar7;
    puVar8 = pSVar4[uVar7].offsets + uVar12;
LAB_004865e1:
    puVar8 = pSVar10->entries[*puVar8].storage.data + 8;
  }
  else {
LAB_004865a6:
    pVar13 = QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::operator++(&local_48.i);
    if (pVar13.d != (Data<QHashPrivate::MultiNode<int,_int>_> *)0x0) {
      pSVar4 = (pVar13.d)->spans;
      uVar7 = pVar13.bucket >> 7;
      pSVar10 = pSVar4 + uVar7;
      puVar8 = pSVar4[uVar7].offsets + ((uint)pVar13.bucket & 0x7f);
      goto LAB_004865e1;
    }
    puVar8 = (uchar *)0x0;
  }
  __return_storage_ptr__->i = pVar13;
  __return_storage_ptr__->e = (Chain **)puVar8;
LAB_00486601:
  this->m_size = this->m_size + -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(d);
        iterator iter = detach(it);
        iterator i = iter;
        Chain *e = *i.e;
        Chain *next = e->next;
        *i.e = next;
        delete e;
        if (!next) {
            if (i.e == &i.i.node()->value) {
                // last remaining entry, erase
                typename Data::Bucket bucket(i.i);
                d->erase(bucket);
                if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
                    i = iterator(++iter.i);
                else // 'i' currently has a nullptr chain. So, we must recreate it
                    i = iterator(bucket.toIterator(d));
            } else {
                i = iterator(++iter.i);
            }
        }
        --m_size;
        Q_ASSERT(m_size >= 0);
        return i;
    }